

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::plot_explicit(Plotter *this,size_t funcid,bool reverse_xy)

{
  Environment *env;
  Expr *pEVar1;
  pointer *pppVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  double dVar4;
  size_t sVar6;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *pvVar7;
  pointer ppVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  _Base_ptr p_Var12;
  size_type sVar13;
  _Rb_tree_node_base *p_Var14;
  uint uVar15;
  pointer pFVar16;
  undefined7 in_register_00000011;
  int sx;
  int iVar17;
  Expr *this_00;
  undefined1 in_R9B;
  int iVar18;
  CritPoint *x;
  ulong uVar19;
  pointer __x;
  pointer pFVar20;
  float fVar21;
  float fVar22;
  double __tmp;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  Plotter *pPVar29;
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar30;
  double __tmp_3;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  float fVar34;
  float fVar35;
  ASTNode AVar36;
  initializer_list<nivalis::Expr::ASTNode> __l;
  pointer pFStackY_380;
  undefined1 in_stack_fffffffffffffc88;
  bool reverse_xy_local;
  byte local_371;
  uint64_t var;
  undefined1 local_368 [16];
  double local_358;
  double local_350;
  double xmin;
  double xmax;
  Expr *local_338;
  float local_32c;
  float local_328;
  allocator_type local_321;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *local_320;
  double local_318;
  undefined8 uStack_310;
  pointer local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  Expr *local_2e0;
  undefined8 local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> to_erase;
  CritPoint cpt;
  double ydiff;
  size_t funcid_local;
  double local_268;
  undefined8 uStack_260;
  double local_258;
  undefined8 uStack_250;
  Expr *local_248;
  Expr *local_240;
  float local_234;
  float local_230;
  uint local_22c;
  Expr diff_sub_expr;
  anon_class_56_7_ff8e18dd draw_extremum;
  float local_1d8;
  float fStack_1d4;
  double local_1b0;
  double __tmp_1;
  double __tmp_2;
  _Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_180;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> curr_line;
  anon_class_24_3_b7f96783 push_critpt_if_valid;
  anon_class_24_3_b7f96783 push_if_valid;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  roots_and_extrema;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  discont;
  anon_class_48_6_1545724e draw_line;
  double MIN_DIST_BETWEEN_ROOTS;
  color ineq_color;
  
  pFVar20 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_371 = this->max_functions_find_all_crit_points <
              (ulong)(((long)(this->funcs).
                             super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar20) / 0x130);
  sVar6 = this->curr_func;
  dVar28 = (this->view).xmax;
  dVar23 = (this->view).xmin;
  __tmp_2 = (this->view).ymax;
  __tmp_1 = (this->view).ymin;
  ydiff = __tmp_2 - __tmp_1;
  uVar3 = (this->view).swid;
  uVar5 = (this->view).shigh;
  fStack_1d4 = (float)(int)uVar5;
  uVar10 = this->x_var;
  local_358 = dVar28 - dVar23;
  xmin = dVar23;
  xmax = dVar28;
  local_1d8 = (float)(int)uVar3;
  if ((int)CONCAT71(in_register_00000011,reverse_xy) != 0) {
    uVar10 = this->y_var;
    local_358 = ydiff;
    xmin = __tmp_1;
    xmax = __tmp_2;
    ydiff = dVar28 - dVar23;
    __tmp_1 = dVar23;
    __tmp_2 = dVar28;
    local_1d8 = fStack_1d4;
    fStack_1d4 = (float)(int)uVar3;
  }
  var = (uint64_t)uVar10;
  pFStackY_380 = pFVar20 + funcid;
  reverse_xy_local = reverse_xy;
  funcid_local = funcid;
  anon_unknown_1::get_ineq_color(&ineq_color,&pFVar20[funcid].line_color);
  dVar28 = ydiff;
  local_2f8 = local_358 * 1e-07;
  push_critpt_if_valid.MIN_DIST_BETWEEN_ROOTS = &MIN_DIST_BETWEEN_ROOTS;
  (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->y_var] = NAN;
  discont._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &discont._M_t._M_impl.super__Rb_tree_header._M_header;
  discont._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  discont._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  discont._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_header;
  roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  push_critpt_if_valid.xmin = &xmin;
  push_critpt_if_valid.xmax = &xmax;
  draw_line.curr_line = &curr_line;
  curr_line.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  curr_line.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  curr_line.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  draw_line.reverse_xy = &reverse_xy_local;
  draw_line.funcid = &funcid_local;
  local_338 = &pFVar20[funcid].diff;
  local_308 = pFStackY_380;
  push_if_valid.xmin = push_critpt_if_valid.xmin;
  push_if_valid.xmax = push_critpt_if_valid.xmax;
  push_if_valid.MIN_DIST_BETWEEN_ROOTS = push_critpt_if_valid.MIN_DIST_BETWEEN_ROOTS;
  roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  discont._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       discont._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  draw_line.func = pFStackY_380;
  draw_line.this = this;
  draw_line.ineq_color = &ineq_color;
  MIN_DIST_BETWEEN_ROOTS = local_2f8;
  bVar9 = Expr::is_null(local_338);
  local_371 = local_371 & sVar6 != funcid;
  local_300 = dVar28 * 1e-10;
  local_2f0 = local_358 / 20.0;
  env = &this->env;
  if ((!bVar9) &&
     ((ulong)(((long)(this->funcs).
                     super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x130) <=
      this->max_functions_find_crit_points)) {
    local_320 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                (local_358 * 1e-09);
    pEVar1 = &local_308->expr;
    local_240 = &local_308->recip;
    local_248 = &local_308->drecip;
    local_2e0 = &local_308->ddiff;
    iVar17 = 0;
    pFStackY_380 = (pointer)0x64;
    local_318 = 0.0;
    while( true ) {
      uStack_310 = 0;
      if (local_1d8 <= (float)iVar17) break;
      if (reverse_xy_local == true) {
        iVar18 = (this->view).shigh;
        local_350 = (this->view).ymin;
        dVar23 = ((this->view).ymax - local_350) * (double)(iVar18 - iVar17);
      }
      else {
        local_350 = (this->view).xmin;
        dVar23 = ((this->view).xmax - local_350) * (double)iVar17;
        iVar18 = (this->view).swid;
      }
      local_350 = dVar23 / (double)iVar18 + local_350;
      (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[var] = local_350;
      local_268 = Expr::operator()(pEVar1,env);
      if (!NAN(local_268)) {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[var] = local_350;
        local_368._0_8_ = Expr::operator()(local_338,env);
        local_368._8_8_ = extraout_XMM0_Qb;
        if (!NAN((double)local_368._0_8_)) {
          if (local_371 == 0) {
            dVar23 = Expr::newton(pEVar1,var,local_350,env,local_2f8,local_300,100,xmin - local_2f0,
                                  xmax + local_2f0,local_338,local_268,(double)local_368._0_8_);
            plot_explicit::anon_class_24_3_b7f96783::operator()
                      (&push_critpt_if_valid,dVar23,3,&roots_and_extrema);
          }
          dVar23 = Expr::newton(local_240,var,local_350,env,local_2f8,local_300,100,xmin - local_2f0
                                ,xmax + local_2f0,local_248,1.0 / local_268,
                                -(double)local_368._0_8_ / (local_268 * local_268));
          plot_explicit::anon_class_24_3_b7f96783::operator()
                    (&push_critpt_if_valid,dVar23,0,&discont);
          if (local_371 == 0) {
            (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[var] = local_350;
            dVar23 = Expr::operator()(local_2e0,env);
            if (!NAN(dVar23)) {
              dVar23 = Expr::newton(local_338,var,local_350,env,local_2f8,local_300,100,
                                    xmin - local_2f0,xmax + local_2f0,local_2e0,
                                    (double)local_368._0_8_,dVar23);
              plot_explicit::anon_class_24_3_b7f96783::operator()
                        (&push_critpt_if_valid,dVar23,4,&roots_and_extrema);
            }
          }
        }
      }
      if ((iVar17 != 0) && (NAN(local_318) != NAN(local_268))) {
        uVar30 = SUB84(local_350,0);
        uVar31 = (int)((ulong)local_350 >> 0x20);
        uVar32 = 0;
        uVar33 = 0;
        while ((double)local_320 < (double)CONCAT44(uVar31,uVar30) - local_258) {
          local_2d8 = (double)CONCAT44(uVar31,uVar30);
          dVar23 = ((double)CONCAT44(uVar31,uVar30) + local_258) * 0.5;
          local_368._8_4_ = uVar32;
          local_368._0_8_ = dVar23;
          local_368._12_4_ = uVar33;
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[var] = dVar23;
          uStack_2d0 = uVar32;
          uStack_2cc = uVar33;
          dVar23 = Expr::operator()(pEVar1,env);
          if (NAN(local_318) == NAN(dVar23)) {
            local_258 = (double)local_368._0_8_;
            uStack_250 = local_368._8_8_;
            uVar30 = (float)local_2d8;
            uVar31 = local_2d8._4_4_;
            uVar32 = uStack_2d0;
            uVar33 = uStack_2cc;
          }
          else {
            uVar30 = local_368._0_4_;
            uVar31 = local_368._4_4_;
            uVar32 = local_368._8_4_;
            uVar33 = local_368._12_4_;
          }
        }
        plot_explicit::anon_class_24_3_b7f96783::operator()
                  (&push_critpt_if_valid,
                   (double)(~-(ulong)NAN(local_318) & (ulong)local_258 |
                           CONCAT44(uVar31,uVar30) & -(ulong)NAN(local_318)),1,&discont);
      }
      iVar17 = iVar17 + 4;
      local_318 = local_268;
      local_258 = local_350;
      uStack_250 = 0;
    }
  }
  draw_extremum.this = (Plotter *)CONCAT44(draw_extremum.this._4_4_,2);
  std::
  set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
  ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
            ((set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              *)&discont,&xmin,(anon_enum_32 *)&draw_extremum);
  draw_extremum.this = (Plotter *)CONCAT44(draw_extremum.this._4_4_,2);
  std::
  set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
  ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
            ((set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
              *)&discont,&xmax,(anon_enum_32 *)&draw_extremum);
  dVar23 = local_358 * 1e-06;
  dVar24 = local_358 * 1e-05;
  local_230 = (float)(local_358 * 9.999999747378752e-05);
  local_1b0 = xmin;
  pEVar1 = &local_308->expr;
  uVar19 = 0;
  p_Var12 = discont._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (fVar34 = SUB84(local_1b0,0),
        (_Rb_tree_header *)p_Var12 != &discont._M_t._M_impl.super__Rb_tree_header) {
    local_2e8 = local_1b0;
    dVar4 = *(double *)(p_Var12 + 1);
    uVar10 = *(uint *)&p_Var12[1]._M_parent;
    pFVar16 = (pointer)(ulong)uVar10;
    uVar30 = (undefined4)((ulong)dVar4 >> 0x20);
    if (reverse_xy_local == true) {
      dVar25 = (this->view).ymax;
      fVar21 = (float)(((double)(this->view).shigh * (dVar25 - dVar4)) /
                      (dVar25 - (this->view).ymin));
      fVar34 = SUB84(dVar4,0);
      fVar22 = local_358._0_4_;
      local_328 = fVar21;
    }
    else {
      dVar25 = (this->view).xmin;
      fVar22 = (float)(((double)(this->view).swid * (dVar4 - dVar25)) / ((this->view).xmax - dVar25)
                      );
      uVar30 = (undefined4)((ulong)local_1b0 >> 0x20);
      fVar21 = local_358._0_4_;
      local_328 = fVar22;
      local_2e8 = dVar4;
    }
    if (uVar19 != 0) {
      bVar9 = (int)pFStackY_380 != 2;
      local_2e0 = (Expr *)CONCAT44(local_2e0._4_4_,fVar21);
      fVar21 = fVar21 + local_230;
      local_320 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                  CONCAT44(local_320._4_4_,fVar22 - local_230);
      local_240 = (Expr *)(dVar23 + (double)CONCAT44(uVar30,fVar34));
      local_248 = (Expr *)((double)CONCAT44(uVar30,fVar34) + dVar24);
      local_268 = *(double *)(&DAT_001fff70 + (ulong)(uVar10 == 0) * 8) * dVar28;
      uStack_260 = 0;
      dVar25 = -local_268;
      fVar35 = -1.0;
      fVar34 = -1.0;
      local_32c = fVar22;
      local_22c = uVar10;
      while( true ) {
        local_2d8 = (double)CONCAT44(local_2d8._4_4_,fVar35);
        local_318 = (double)CONCAT44(local_318._4_4_,fVar34);
        if (local_320._0_4_ <= fVar21) break;
        local_368._0_4_ = fVar21;
        if (reverse_xy_local == true) {
          iVar17 = (this->view).shigh;
          dVar26 = (this->view).ymin;
          uVar30 = SUB84(dVar26,0);
          uVar31 = (undefined4)((ulong)dVar26 >> 0x20);
          dVar26 = ((this->view).ymax - dVar26) * (double)((float)iVar17 - fVar21);
        }
        else {
          dVar26 = (this->view).xmin;
          uVar30 = SUB84(dVar26,0);
          uVar31 = (undefined4)((ulong)dVar26 >> 0x20);
          dVar26 = ((this->view).xmax - dVar26) * (double)fVar21;
          iVar17 = (this->view).swid;
        }
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[var] =
             dVar26 / (double)iVar17 + (double)CONCAT44(uVar31,uVar30);
        dVar26 = Expr::operator()(pEVar1,env);
        if (NAN(dVar26)) {
          fVar34 = -1.0;
          fVar21 = (float)local_368._0_4_;
          fVar35 = (float)local_2d8;
        }
        else {
          dVar27 = __tmp_2 + ydiff;
          if ((dVar26 <= __tmp_2 + ydiff) && (dVar27 = dVar26, dVar26 < __tmp_1 - ydiff)) {
            dVar27 = __tmp_1 - ydiff;
          }
          if (reverse_xy_local == true) {
            dVar26 = (this->view).xmin;
            dVar27 = (double)(this->view).swid * (dVar27 - dVar26);
            dVar26 = (this->view).xmax - dVar26;
          }
          else {
            dVar26 = (this->view).ymax;
            dVar27 = (double)(this->view).shigh * (dVar26 - dVar27);
            dVar26 = dVar26 - (this->view).ymin;
          }
          local_258 = (double)CONCAT44(local_258._4_4_,(float)(dVar27 / dVar26));
          fVar34 = (float)local_368._0_4_;
          fVar35 = (float)(dVar27 / dVar26);
          if (bVar9) {
            (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[var] = (double)local_240;
            local_350 = Expr::operator()(pEVar1,env);
            (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[var] = (double)local_248;
            dVar26 = Expr::operator()(pEVar1,env);
            fVar34 = (float)local_368._0_4_;
            fVar35 = local_258._0_4_;
            if ((local_350 - dVar26 <= local_268) ||
               (fVar21 = 0.0, fVar22 = local_2e0._0_4_, local_258._0_4_ <= 0.0)) {
              if (dVar25 <= local_350 - dVar26) goto LAB_00139ff7;
              fVar21 = (float)local_2d8;
              fVar22 = local_318._0_4_;
              if (local_258._0_4_ < fStack_1d4) {
                fVar21 = fStack_1d4;
                fVar22 = local_2e0._0_4_;
              }
            }
          }
          else {
LAB_00139ff7:
            fVar21 = (float)local_2d8;
            fVar22 = local_318._0_4_;
          }
          if (0.0 <= fVar22) {
            plot_explicit::anon_class_48_6_1545724e::operator()
                      (&draw_line,fVar22,fVar21,fVar34,fVar35);
            fVar34 = (float)local_368._0_4_;
            fVar35 = local_258._0_4_;
          }
          bVar9 = false;
          fVar21 = fVar34;
        }
        fVar22 = 0.2;
        if (discont._M_t._M_impl.super__Rb_tree_header._M_node_count - 3 < 0x61) {
          if (uVar19 != 1) {
            fVar22 = 0.1;
            if (fVar21 - local_358._0_4_ < 1.0) goto LAB_0013a0a6;
          }
          if ((discont._M_t._M_impl.super__Rb_tree_header._M_node_count - 1 <= uVar19) ||
             (fVar22 = 0.1, 1.0 <= local_328 - fVar21)) {
            fVar22 = 0.2;
          }
        }
LAB_0013a0a6:
        fVar21 = fVar21 + fVar22;
      }
      pFVar16 = (pointer)(ulong)local_22c;
      if (local_22c != 2) {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[var] = local_2e8 - dVar23;
        dVar26 = Expr::operator()(pEVar1,env);
        local_368._0_8_ = dVar26;
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[var] = local_2e8 - dVar24;
        dVar26 = Expr::operator()(pEVar1,env);
        dVar26 = (double)local_368._0_8_ - dVar26;
        fVar34 = 0.0;
        if ((float)local_2d8 <= 0.0 || dVar26 <= local_268) {
          fVar34 = local_234;
        }
        fVar21 = local_32c;
        if ((float)local_2d8 <= 0.0 || dVar26 <= local_268) {
          fVar21 = -1.0;
        }
        local_234 = fStack_1d4;
        if (dVar25 <= dVar26 || fStack_1d4 <= (float)local_2d8) {
          local_234 = fVar34;
          local_32c = fVar21;
        }
        if ((0.0 <= local_318._0_4_) && (0.0 <= local_32c)) {
          plot_explicit::anon_class_48_6_1545724e::operator()
                    (&draw_line,local_318._0_4_,(float)local_2d8,local_32c,local_234);
        }
      }
    }
    uVar19 = uVar19 + 1;
    p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    local_358 = (double)CONCAT44(local_358._4_4_,local_328);
    pFStackY_380 = pFVar16;
    local_1b0 = dVar4;
  }
  if ((8 < (ulong)((long)curr_line.
                         super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)curr_line.
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)) && ((local_308->type & 2) == 0))
  {
    anon_unknown_1::buf_add_screen_polyline
              (&this->draw_buf,&this->view,&curr_line,&pFVar20[funcid].line_color,funcid_local,
               fVar34,(bool)in_R9B,(bool)in_stack_fffffffffffffc88,var._0_1_);
  }
  if ((ulong)(((long)(this->funcs).
                     super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x130) <=
      this->max_functions_find_crit_points) {
    if (local_371 == 0) {
      draw_extremum.to_erase = &to_erase;
      to_erase.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      to_erase.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      to_erase.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      draw_extremum.var = &var;
      draw_extremum.func = local_308;
      draw_extremum.reverse_xy = &reverse_xy_local;
      draw_extremum.ydiff = &ydiff;
      draw_extremum.funcid = &funcid_local;
      draw_extremum.this = this;
      for (p_Var12 = roots_and_extrema._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ppVar8 = to_erase.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          (_Rb_tree_header *)p_Var12 != &roots_and_extrema._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[var] = *(double *)(p_Var12 + 1);
        dVar28 = Expr::operator()(pEVar1,env);
        plot_explicit::anon_class_56_7_ff8e18dd::operator()
                  (&draw_extremum,(CritPoint *)(p_Var12 + 1),dVar28);
      }
      for (__x = to_erase.
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != ppVar8; __x = __x + 1) {
        std::
        _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
        ::erase(&roots_and_extrema._M_t,__x);
      }
      bVar9 = Expr::is_null(pEVar1);
      if ((!bVar9) && (bVar9 = Expr::is_null(local_338), !bVar9)) {
        (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[var] = 0.0;
        dVar28 = Expr::operator()(pEVar1,env);
        local_368._0_8_ = dVar28;
        if ((ulong)ABS(dVar28) < 0x7ff0000000000000) {
          plot_explicit::anon_class_24_3_b7f96783::operator()
                    (&push_critpt_if_valid,0.0,5,&roots_and_extrema);
          cpt.first = 0.0;
          cpt.second = 5;
          sVar13 = std::
                   set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                   ::count(&roots_and_extrema,&cpt);
          if (sVar13 != 0) {
            plot_explicit::anon_class_56_7_ff8e18dd::operator()
                      (&draw_extremum,&cpt,(double)local_368._0_8_);
          }
        }
      }
      std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
      ~_Vector_base(&to_erase.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   );
    }
    bVar9 = Expr::is_null(local_338);
    if (!bVar9) {
      pFVar20 = (this->funcs).
                super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar16 = (this->funcs).
                super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pFVar16 - (long)pFVar20) / 0x130) <= this->max_functions_find_crit_points
          && (local_371 & 1) == 0) {
        local_318 = local_2f8 * 10.0;
        local_2d8 = local_300 * 10.0;
        local_320 = &this->pt_markers;
        dVar28 = 0.0;
        while( true ) {
          dVar23 = (double)(((long)pFVar16 - (long)pFVar20) / 0x130);
          if ((ulong)dVar23 <= this->max_functions_find_all_crit_points) {
            dVar23 = (double)funcid_local;
          }
          if ((ulong)dVar23 <= (ulong)dVar28) break;
          this_00 = &pFVar20[(long)dVar28].diff;
          local_258 = dVar28;
          bVar9 = Expr::is_null(this_00);
          if (!bVar9) {
            uVar10 = local_308->type & 0xfffffff8;
            uVar15 = pFVar20[(long)dVar28].type & 0xfffffff8;
            if (uVar10 == uVar15) {
              Expr::operator-((Expr *)&cpt,pEVar1,&pFVar20[(long)dVar28].expr);
              Expr::operator-(&diff_sub_expr,local_338,this_00);
              pppVar2 = &to_erase.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              bVar9 = Expr::is_null(&diff_sub_expr);
              if (!bVar9) {
                to_erase.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((ulong)to_erase.
                                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish &
                              0xffffffff00000000);
                to_erase.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                iVar18 = 0;
                for (iVar17 = 0; pvVar7 = local_320, p_Var14 = (_Rb_tree_node_base *)pppVar2,
                    (float)iVar17 < local_1d8; iVar17 = iVar17 + 10) {
                  if (reverse_xy_local == true) {
                    iVar11 = (this->view).shigh;
                    dVar28 = (this->view).ymin;
                    uVar30 = SUB84(dVar28,0);
                    uVar31 = (undefined4)((ulong)dVar28 >> 0x20);
                    dVar28 = ((this->view).ymax - dVar28) * (double)(iVar18 + iVar11);
                  }
                  else {
                    dVar28 = (this->view).xmin;
                    uVar30 = SUB84(dVar28,0);
                    uVar31 = (undefined4)((ulong)dVar28 >> 0x20);
                    dVar28 = ((this->view).xmax - dVar28) * (double)iVar17;
                    iVar11 = (this->view).swid;
                  }
                  dVar28 = Expr::newton((Expr *)&cpt,var,
                                        dVar28 / (double)iVar11 + (double)CONCAT44(uVar31,uVar30),
                                        env,local_2f8,local_300,100,xmin - local_2f0,
                                        xmax + local_2f0,&diff_sub_expr,1.79769313486232e+308,
                                        1.79769313486232e+308);
                  plot_explicit::anon_class_24_3_b7f96783::operator()
                            (&push_if_valid,dVar28,
                             (set<double,_std::less<double>,_std::allocator<double>_> *)&to_erase);
                  iVar18 = iVar18 + -10;
                }
                for (; p_Var14 != (_Rb_tree_node_base *)pppVar2;
                    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
                  local_368._0_8_ = *(double *)(p_Var14 + 1);
                  (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[var] = *(double *)(p_Var14 + 1);
                  pPVar29 = (Plotter *)Expr::operator()(pEVar1,env);
                  draw_extremum.func = (value_type *)CONCAT44(draw_extremum.func._4_4_,5);
                  draw_extremum.this = (Plotter *)local_368._0_8_;
                  draw_extremum.var = (uint64_t *)pPVar29;
                  if (reverse_xy_local == true) {
                    draw_extremum.var = (uint64_t *)local_368._0_8_;
                    draw_extremum.this = pPVar29;
                  }
                  draw_extremum.funcid =
                       (size_t *)((ulong)draw_extremum.funcid & 0xffffffffffffff00);
                  draw_extremum.reverse_xy = (bool *)0xffffffffffffffff;
                  draw_extremum.ydiff = (double *)0xffffffffffffffff;
                  draw_extremum.to_erase =
                       (vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                       0xffffffffffffffff;
                  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                  emplace_back<nivalis::PointMarker>(pvVar7,(PointMarker *)&draw_extremum);
                }
LAB_0013aeae:
                std::
                _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                ::~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                             *)&to_erase);
              }
            }
            else {
              if (uVar15 + uVar10 != 8) goto LAB_0013aed5;
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                        ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         &cpt,&pFVar20[(long)dVar28].expr.ast);
              uVar19 = (ulong)this->x_var;
              if (var == uVar19) {
                uVar19 = (ulong)this->y_var;
              }
              local_368._0_8_ = uVar19;
              Expr::sub_var((Expr *)&cpt,(uint32_t)uVar19,pEVar1);
              AVar36 = Expr::ASTNode::varref(var);
              local_180._M_impl.super__Vector_impl_data._M_finish = (pointer)AVar36.field_1;
              local_180._M_impl.super__Vector_impl_data._M_start._0_4_ = AVar36.opcode;
              __l._M_len = 1;
              __l._M_array = (iterator)&local_180;
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                        (&diff_sub_expr.ast,__l,&local_321);
              Expr::Expr((Expr *)&to_erase,&diff_sub_expr.ast);
              Expr::operator-((Expr *)&draw_extremum,(Expr *)&cpt,(Expr *)&to_erase);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_move_assign((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              *)&cpt,&draw_extremum);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)&draw_extremum);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)&to_erase);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)&diff_sub_expr);
              Expr::optimize((Expr *)&cpt,5);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                        (&diff_sub_expr.ast,&this_00->ast);
              Expr::sub_var(&diff_sub_expr,local_368._0_4_,pEVar1);
              Expr::operator*((Expr *)&to_erase,&diff_sub_expr,local_338);
              Expr::constant((Expr *)&local_180,1.0);
              Expr::operator-((Expr *)&draw_extremum,(Expr *)&to_erase,(Expr *)&local_180);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_move_assign(&diff_sub_expr.ast,&draw_extremum);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)&draw_extremum);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base(&local_180);
              std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)&to_erase);
              Expr::optimize(&diff_sub_expr,5);
              bVar9 = Expr::is_null(&diff_sub_expr);
              if (!bVar9) {
                to_erase.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((ulong)to_erase.
                                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish &
                              0xffffffff00000000);
                to_erase.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                p_Var14 = (_Rb_tree_node_base *)
                          &to_erase.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                iVar18 = 0;
                for (iVar17 = 0; pvVar7 = local_320, (float)iVar17 < local_1d8; iVar17 = iVar17 + 2)
                {
                  if (reverse_xy_local == true) {
                    iVar11 = (this->view).shigh;
                    dVar28 = (this->view).ymin;
                    uVar30 = SUB84(dVar28,0);
                    uVar31 = (undefined4)((ulong)dVar28 >> 0x20);
                    dVar28 = ((this->view).ymax - dVar28) * (double)(iVar18 + iVar11);
                  }
                  else {
                    dVar28 = (this->view).xmin;
                    uVar30 = SUB84(dVar28,0);
                    uVar31 = (undefined4)((ulong)dVar28 >> 0x20);
                    dVar28 = ((this->view).xmax - dVar28) * (double)iVar17;
                    iVar11 = (this->view).swid;
                  }
                  dVar28 = Expr::newton((Expr *)&cpt,var,
                                        dVar28 / (double)iVar11 + (double)CONCAT44(uVar31,uVar30),
                                        env,local_318,local_2d8,100,xmin - local_2f0,
                                        xmax + local_2f0,&diff_sub_expr,1.79769313486232e+308,
                                        1.79769313486232e+308);
                  plot_explicit::anon_class_24_3_b7f96783::operator()
                            (&push_if_valid,dVar28,
                             (set<double,_std::less<double>,_std::allocator<double>_> *)&to_erase);
                  iVar18 = iVar18 + -2;
                }
                for (; p_Var14 !=
                       (_Rb_tree_node_base *)
                       &to_erase.
                        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
                    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
                  local_368._0_8_ = *(double *)(p_Var14 + 1);
                  (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[var] = *(double *)(p_Var14 + 1);
                  pPVar29 = (Plotter *)Expr::operator()(pEVar1,env);
                  draw_extremum.func = (value_type *)CONCAT44(draw_extremum.func._4_4_,5);
                  draw_extremum.this = (Plotter *)local_368._0_8_;
                  draw_extremum.var = (uint64_t *)pPVar29;
                  if (reverse_xy_local == true) {
                    draw_extremum.var = (uint64_t *)local_368._0_8_;
                    draw_extremum.this = pPVar29;
                  }
                  draw_extremum.funcid =
                       (size_t *)((ulong)draw_extremum.funcid & 0xffffffffffffff00);
                  draw_extremum.reverse_xy = (bool *)0xffffffffffffffff;
                  draw_extremum.ydiff = (double *)0xffffffffffffffff;
                  draw_extremum.to_erase =
                       (vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                       0xffffffffffffffff;
                  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                  emplace_back<nivalis::PointMarker>(pvVar7,(PointMarker *)&draw_extremum);
                }
                goto LAB_0013aeae;
              }
            }
            std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           *)&diff_sub_expr);
            std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           *)&cpt);
          }
LAB_0013aed5:
          dVar28 = (double)((long)local_258 + 1);
          pFVar20 = (this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar16 = (this->funcs).
                    super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
      }
    }
  }
  std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~_Vector_base
            (&curr_line.
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>);
  std::
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~_Rb_tree(&roots_and_extrema._M_t);
  std::
  _Rb_tree<std::pair<double,_int>,_std::pair<double,_int>,_std::_Identity<std::pair<double,_int>_>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~_Rb_tree(&discont._M_t);
  return;
}

Assistant:

void Plotter::plot_explicit(size_t funcid, bool reverse_xy) {
    const bool find_all_crit_pts = funcs.size() <= max_functions_find_all_crit_points
                                     || funcid == curr_func;

    double xdiff = view.xmax - view.xmin, ydiff = view.ymax - view.ymin;
    float swid = view.swid, shigh = view.shigh;
    double xmin = view.xmin, xmax = view.xmax;
    double ymin = view.ymin, ymax = view.ymax;
    uint64_t var = x_var;
    if (reverse_xy) {
        std::swap(xdiff, ydiff);
        std::swap(xmin, ymin);
        std::swap(xmax, ymax);
        std::swap(swid, shigh);
        var = y_var;
    }
    auto& func = funcs[funcid];
    color::color ineq_color = get_ineq_color(func.line_color);


    // Constants
    // Newton's method parameters
    const double EPS_STEP  = 1e-7 * xdiff;
    const double EPS_ABS   = 1e-10 * ydiff;
    static const int MAX_ITER  = 100;
    // Shorthand for Newton's method arguments
#define NEWTON_ARGS var, x, env, EPS_STEP, EPS_ABS, MAX_ITER, \
    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW
    // Amount x-coordinate is allowed to exceed the display boundaries
    const double NEWTON_SIDE_ALLOW = xdiff / 20.;


    // x-epsilon for domain bisection
    // (finding cutoff where function becomes undefined)
    const double DOMAIN_BISECTION_EPS = 1e-9 * xdiff;

    // Asymptote check constants:
    // Assume asymptote at discontinuity if slope between
    // x + ASYMPTOTE_CHECK_DELTA1, x + ASYMPTOTE_CHECK_DELTA2
    const double ASYMPTOTE_CHECK_DELTA1 = xdiff * 1e-6;
    const double ASYMPTOTE_CHECK_DELTA2 = xdiff * 1e-5;
    const double ASYMPTOTE_CHECK_EPS    = ydiff * 1e-9;
    // Special eps for boundary of domain
    const double ASYMPTOTE_CHECK_BOUNDARY_EPS = ydiff * 1e-3;

    // For explicit functions
    // We will draw a function segment between every pair of adjacent
    // discontinuities (including 'edge of screen')
    // x-coordinate after a discontinuity to begin drawing function
    const float DISCONTINUITY_EPS = 1e-4f * xdiff;

    // Minimum x-distance between critical points
    const double MIN_DIST_BETWEEN_ROOTS  = 1e-7 * xdiff;

    env.vars[y_var] = std::numeric_limits<double>::quiet_NaN();
    // Discontinuity/root/extremum type enum
    enum {
        DISCONT_ASYMPT = 0, // asymptote (in middle of domain, e.g. 0 of 1/x)
        DISCONT_DOMAIN,     // domain boundary (possibly asymptote, e.g. 0 of ln(x))
        DISCONT_SCREEN,     // edge of screen
        ROOT,               // root
        EXTREMUM,           // extremum
        Y_INT,              // y-intercept
    };
    // CritPoint: discontinuity/root/extremum type
    // first: x-position second: enum
    using CritPoint = std::pair<double, int>;
    // Store discontinuities
    std::set<CritPoint> discont, roots_and_extrema;
    size_t idx = 0;
    // Push check helpers
    // Push to st if no other item less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_if_valid = [&](double value, std::set<double>& st) {
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(value);
            double cdist = 1.;
            if (it != st.end()) cdist = *it - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - *itp);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) st.insert(value);
        }
    };
    // Push (value, type) to discont if no other distcontinuity's first item
    // is less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_critpt_if_valid = [&](double value,
            CritPoint::second_type type,
            std::set<CritPoint>& st) {
        auto vc = CritPoint(value, type);
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(vc);
            double cdist = 1.;
            if (it != st.end())
                cdist = it->first - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - itp->first);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) {
                st.insert(vc);
            }
        }
    };

    // Stores points in current line, which will be drawn as a polyline
    std::vector<std::array<float, 2> > curr_line;
    // Draw a line and construct markers along the line
    // to allow clicking
    auto draw_line = [&](float psx, float psy, float sx, float sy) {
        if (reverse_xy) {
            std::swap(sx, sy);
            std::swap(psx, psy);
        }
        // Draw the line
        if (curr_line.empty() ||
                (psx > curr_line.back()[0] || psy != curr_line.back()[1])) {
            if (curr_line.size() > 1 &&
                    (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
            }
            curr_line.resize(2);
            curr_line[0] = {psx, psy};
            curr_line[1] = {sx, sy};
        } else {
            curr_line.push_back({sx, sy});
        }
        // Draw inequality region
        if (func.type & Function::FUNC_TYPE_MOD_INEQ) {
            if (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            0, psy, sx, sy - psy, true, ineq_color, 0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, sy, sx - psx, view.shigh - sy, true, ineq_color,
                            0.0f, funcid);
                }
            } else {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, psy, view.swid - psx, sy - psy, true, ineq_color,
                            0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, 0, sx - psx, sy, true, ineq_color, 0.0f,
                            funcid);
                }
            }
        }
    };
    // ** Find roots, asymptotes, extrema
    if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
        double prev_x, prev_y = 0.;
        for (int sx = 0; sx < swid; sx += 4) {
            const double x = reverse_xy ? _SY_TO_Y(sx) : _SX_TO_X(sx);
            env.vars[var] = x;
            double y = func.expr(env);
            const bool is_y_nan = std::isnan(y);

            if (!is_y_nan) {
                env.vars[var] = x;
                double dy = func.diff(env);
                if (!std::isnan(dy)) {
                    if (find_all_crit_pts) {
                        double root = func.expr.newton(NEWTON_ARGS, &func.diff, y, dy);
                        push_critpt_if_valid(root, ROOT, roots_and_extrema);
                    }
                    double asymp = func.recip.newton(NEWTON_ARGS,
                            &func.drecip, 1. / y, -dy / (y*y));
                    push_critpt_if_valid(asymp, DISCONT_ASYMPT, discont);

                    if (find_all_crit_pts) {
                        env.vars[var] = x;
                        double ddy = func.ddiff(env);
                        if (!std::isnan(ddy)) {
                            double extr = func.diff.newton(NEWTON_ARGS,
                                    &func.ddiff, dy, ddy);
                            push_critpt_if_valid(extr, EXTREMUM, roots_and_extrema);
                        }
                    }
                }
            }
            if (sx) {
                const bool is_prev_y_nan = std::isnan(prev_y);
                if (is_y_nan != is_prev_y_nan) {
                    // Search for cutoff via bisection
                    double lo = prev_x, hi = x;
                    while (hi - lo > DOMAIN_BISECTION_EPS) {
                        double mi = (lo + hi) * 0.5;
                        env.vars[var] = mi; double mi_y = func.expr(env);
                        if (std::isnan(mi_y) == is_prev_y_nan) {
                            lo = mi;
                        } else {
                            hi = mi;
                        }
                    }
                    double boundary_x_not_nan_side = is_prev_y_nan ? hi : lo;
                    push_critpt_if_valid(boundary_x_not_nan_side,
                            DISCONT_DOMAIN, discont);
                }
            }
            prev_x = x; prev_y = y;
        }
    }
    // Add screen edges to discontinuities list for convenience
    discont.emplace(xmin, DISCONT_SCREEN);
    discont.emplace(xmax, DISCONT_SCREEN);

    // Previous discontinuity infop
    double prev_discont_x = xmin;
    float prev_discont_sx;
    int prev_discont_type;
    size_t as_idx = 0;

    // ** Main explicit func drawing code: draw function from discont to discont
    for (const auto& discontinuity : discont) {
        float psx = -1.f, psy = -1.f;
        double discont_x = discontinuity.first;
        int discont_type = discontinuity.second;
        float discont_sx = reverse_xy ? _Y_TO_SY(discont_x) : _X_TO_SX(discont_x);

        if (as_idx > 0) {
            bool connector = prev_discont_type != DISCONT_SCREEN;
            double x_begin = prev_discont_x, x_end = discont_x;
            float sx_begin = prev_discont_sx, sx_end = discont_sx;
            if (reverse_xy) {
                std::swap(sx_begin, sx_end);
                std::swap(x_begin, x_end);
            }
            // Draw func between asymptotes
            for (float sxd = sx_begin + DISCONTINUITY_EPS; sxd < sx_end - DISCONTINUITY_EPS;) {
                const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                env.vars[var] = x;
                double y = func.expr(env);

                if (!std::isnan(y)) {
                    if (y > ymax + ydiff) y = ymax + ydiff;
                    else if (y < ymin - ydiff) y = ymin - ydiff;
                    float sy = reverse_xy ?  _X_TO_SX(y) : _Y_TO_SY(y), sx = sxd;
                    if (connector) {
                        // Check if asymptote at previous position;
                        // if so then connect it
                        connector = false;
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA1;
                        double yp = func.expr(env);
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA2;
                        double yp2 = func.expr(env);
                        double eps = discont_type == DISCONT_ASYMPT ?
                            ASYMPTOTE_CHECK_EPS:
                            ASYMPTOTE_CHECK_BOUNDARY_EPS;
                        if (yp - yp2 > eps && sy > 0.f) {
                            psx = sx_begin;
                            psy = 0.f;
                        } else if (yp - yp2 < -eps && sy < (float)shigh) {
                            psx = sx_begin;
                            psy = static_cast<float>(shigh);
                        }
                    }
                    if (psx >= 0.0) draw_line(psx, psy, sx, sy);
                    psx = sx;
                    psy = sy;
                } else {
                    psx = -1;
                }
                if (discont.size() > 2 && discont.size() < 100) {
                    if ((as_idx > 1 && sxd - prev_discont_sx < 1.) ||
                            (as_idx < discont.size() - 1 && discont_sx - sxd < 1.)) {
                        sxd += 0.1f;
                    } else {
                        sxd += 0.2f;
                    }
                } else {
                    sxd += 0.2f;
                }
            }
            // Connect next asymptote
            if (discont_type != DISCONT_SCREEN) {
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA1;
                double yp = func.expr(env);
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA2;
                double yp2 = func.expr(env);
                float sx = -1, sy;
                double eps = discont_type == DISCONT_ASYMPT ?
                    ASYMPTOTE_CHECK_EPS:
                    ASYMPTOTE_CHECK_BOUNDARY_EPS;
                if (yp - yp2 > eps && psy > 0) {
                    sx = static_cast<float>(sx_end);
                    sy = 0.f;
                }
                if (yp - yp2 < -eps && psy < shigh) {
                    sx = sx_end;
                    sy = static_cast<float>(shigh);
                }
                if (psx >= 0.f && sx >= 0.f) {
                    draw_line(psx, psy, sx, sy);
                }
            }
        }
        ++as_idx;
        prev_discont_x = discont_x;
        prev_discont_type = discont_type;
        prev_discont_sx = discont_sx;
    }

    // Finish last line, if exists
    if (curr_line.size() > 1 && (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
        buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
    }
    if (funcs.size() <= max_functions_find_crit_points) {
        if (find_all_crit_pts) {
            std::vector<CritPoint> to_erase; // Save dubious points to delete from roots_and_extrama
            // Helper to draw roots/extrema/y-int and add a marker for it
            auto draw_extremum = [&](const CritPoint& cpt, double y) {
                env.vars[var] = cpt.first;
                double dy = func.diff(env);
                double ddy = func.ddiff(env);
                double x; int type;
                std::tie(x, type) = cpt;
                auto label =
                    type == Y_INT ? (reverse_xy ? PointMarker::LABEL_X_INT : PointMarker::LABEL_Y_INT) :
                    type == ROOT ? (reverse_xy ? PointMarker::LABEL_Y_INT : PointMarker::LABEL_X_INT) :
                    (type == EXTREMUM && ddy > 1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MIN :
                    (type == EXTREMUM && ddy < -1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MAX:
                    type == EXTREMUM ? PointMarker::LABEL_INFLECTION_PT:
                    PointMarker::LABEL_NONE;
                // Do not show
                if (label == PointMarker::LABEL_INFLECTION_PT ||
                        label == PointMarker::LABEL_NONE) {
                    to_erase.push_back(cpt);
                    return;
                }

                PointMarker ptm;
                ptm.label = label;
                ptm.y = y; ptm.x = x;
                if (reverse_xy) std::swap(ptm.x, ptm.y);
                if (type == Y_INT) label = PointMarker::LABEL_X_INT;
                else if (type == ROOT) label = PointMarker::LABEL_Y_INT;
                ptm.passive = false;
                ptm.rel_func = funcid;
                ptm.drag_var_x = ptm.drag_var_y = -1;
                pt_markers.push_back(std::move(ptm));
            };
            for (const CritPoint& cpt : roots_and_extrema) {
                env.vars[var] = cpt.first;
                double y = func.expr(env);
                draw_extremum(cpt, y);
            }
            // Delete the "dubious" points
            for (const CritPoint& x : to_erase) {
                roots_and_extrema.erase(x);
            }
            if (!func.expr.is_null() && !func.diff.is_null()) {
                env.vars[var] = 0;
                double y = func.expr(env);
                if (!std::isnan(y) && !std::isinf(y)) {
                    push_critpt_if_valid(0., Y_INT, roots_and_extrema); // y-int
                    auto cpt = CritPoint(0., Y_INT);
                    if (roots_and_extrema.count(cpt)) {
                        draw_extremum(cpt, y);
                    }
                }
            }
        }

        // Function intersection
        if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
            if (find_all_crit_pts) {
                for (size_t funcid2 = 0; funcid2 < (funcs.size() <= max_functions_find_all_crit_points
                                                    ? funcid : funcs.size()); ++funcid2) {
                    auto& func2 = funcs[funcid2];
                    if (func2.diff.is_null()) continue;
                    int ft_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
                    int f2t_nomod = func2.type & ~Function::FUNC_TYPE_MOD_ALL;
                    if (ft_nomod == f2t_nomod) {
                        // Same direction, use Newton on difference.
                        Expr sub_expr = func.expr - func2.expr;
                        Expr diff_sub_expr = func.diff - func2.diff;
                        // diff_sub_expr.optimize();
                        if (diff_sub_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 10) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = sub_expr.newton(NEWTON_ARGS, &diff_sub_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } else if (ft_nomod + f2t_nomod == 8) {
                        // Inverse direction, use Newton on composition.
                        Expr comp_expr = func2.expr;
                        auto other_var = var == x_var ? y_var  : x_var;
                        comp_expr.sub_var(other_var, func.expr);
                        comp_expr = comp_expr - Expr::AST{Expr::ASTNode::varref(var)};
                        comp_expr.optimize();

                        Expr diff_comp_expr = func2.diff;
                        diff_comp_expr.sub_var(other_var, func.expr);
                        diff_comp_expr = diff_comp_expr * func.diff - Expr::constant(1.);
                        diff_comp_expr.optimize();
                        if (diff_comp_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 2) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = comp_expr.newton(
                                    var, x, env, EPS_STEP * 10.f, EPS_ABS * 10.f, MAX_ITER,
                                    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW,
                                    &diff_comp_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } // if
                    // o.w. not supported.
                } // for funcid2
            } // if (find_all_intersections || funcid == curr_func)
        } // if (!func.diff.is_null())
    } // if (funcs.size() <= max_functions_find_crit_points)
    // * End of function intersection code
}